

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O2

bool __thiscall Thread::isAutoDelete(Thread *this)

{
  bool bVar1;
  
  std::mutex::lock(&this->mMutex);
  bVar1 = this->mAutoDelete;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
  return bVar1;
}

Assistant:

bool isAutoDelete() const
    {
        std::lock_guard<std::mutex> lock(mMutex);
        return mAutoDelete;
    }